

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

long src_callback_read(SRC_STATE *state,double src_ratio,long frames,float *data)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  float *ptr;
  float dummy [1];
  int error;
  long output_frames_gen;
  SRC_DATA src_data;
  SRC_PRIVATE *psrc;
  undefined1 *local_88;
  undefined4 in_stack_ffffffffffffff80;
  int iVar2;
  SRC_STATE *state_00;
  undefined1 *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  int local_40;
  double local_38;
  long local_30;
  long local_28;
  long local_20;
  double local_18;
  SRC_STATE *local_8;
  
  iVar2 = 0;
  if (in_RDI == 0) {
    local_8 = (SRC_STATE *)0x0;
  }
  else if (in_RSI < 1) {
    local_8 = (SRC_STATE *)0x0;
  }
  else if (*(int *)(in_RDI + 0x18) == 0x22c) {
    if (*(long *)(in_RDI + 0x40) == 0) {
      *(undefined4 *)(in_RDI + 0x10) = 0x13;
      local_8 = (SRC_STATE *)0x0;
    }
    else {
      local_30 = in_RDI;
      local_28 = in_RDX;
      local_20 = in_RSI;
      local_18 = in_XMM0_Qa;
      memset(&local_70,0,0x40);
      iVar1 = is_bad_src_ratio(local_18);
      if (iVar1 == 0) {
        local_38 = local_18;
        local_68 = local_28;
        local_58 = local_20;
        local_70 = *(undefined1 **)(local_30 + 0x58);
        local_60 = *(long *)(local_30 + 0x50);
        state_00 = (SRC_STATE *)0x0;
        do {
          if (local_20 <= (long)state_00) break;
          if (local_60 == 0) {
            local_88 = &stack0xffffffffffffff80;
            local_60 = (**(code **)(local_30 + 0x40))(*(undefined8 *)(local_30 + 0x48),&local_88);
            local_70 = local_88;
            if (local_60 == 0) {
              local_40 = 1;
            }
          }
          *(undefined4 *)(local_30 + 0x18) = 0x22b;
          iVar2 = src_process(state_00,(SRC_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff80));
          *(undefined4 *)(local_30 + 0x18) = 0x22c;
          if (iVar2 != 0) break;
          local_70 = local_70 + local_50 * *(int *)(local_30 + 0x14) * 4;
          local_60 = local_60 - local_50;
          local_68 = local_48 * *(int *)(local_30 + 0x14) * 4 + local_68;
          local_58 = local_58 - local_48;
          state_00 = state_00 + local_48;
        } while ((local_40 != 1) || (local_48 != 0));
        *(undefined1 **)(local_30 + 0x58) = local_70;
        *(long *)(local_30 + 0x50) = local_60;
        local_8 = state_00;
        if (iVar2 != 0) {
          *(int *)(local_30 + 0x10) = iVar2;
          local_8 = (SRC_STATE *)0x0;
        }
      }
      else {
        *(undefined4 *)(local_30 + 0x10) = 6;
        local_8 = (SRC_STATE *)0x0;
      }
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x10) = 0x12;
    local_8 = (SRC_STATE *)0x0;
  }
  return (long)local_8;
}

Assistant:

long
src_callback_read (SRC_STATE *state, double src_ratio, long frames, float *data)
{	SRC_PRIVATE	*psrc ;
	SRC_DATA	src_data ;

	long	output_frames_gen ;
	int		error = 0 ;

	if (state == NULL)
		return 0 ;

	if (frames <= 0)
		return 0 ;

	psrc = (SRC_PRIVATE*) state ;

	if (psrc->mode != SRC_MODE_CALLBACK)
	{	psrc->error = SRC_ERR_BAD_MODE ;
		return 0 ;
		} ;

	if (psrc->callback_func == NULL)
	{	psrc->error = SRC_ERR_NULL_CALLBACK ;
		return 0 ;
		} ;

	memset (&src_data, 0, sizeof (src_data)) ;

	/* Check src_ratio is in range. */
	if (is_bad_src_ratio (src_ratio))
	{	psrc->error = SRC_ERR_BAD_SRC_RATIO ;
		return 0 ;
		} ;

	/* Switch modes temporarily. */
	src_data.src_ratio = src_ratio ;
	src_data.data_out = data ;
	src_data.output_frames = frames ;

	src_data.data_in = psrc->saved_data ;
	src_data.input_frames = psrc->saved_frames ;

	output_frames_gen = 0 ;
	while (output_frames_gen < frames)
	{	/*	Use a dummy array for the case where the callback function
		**	returns without setting the ptr.
		*/
		float dummy [1] ;

		if (src_data.input_frames == 0)
		{	float *ptr = dummy ;

			src_data.input_frames = psrc->callback_func (psrc->user_callback_data, &ptr) ;
			src_data.data_in = ptr ;

			if (src_data.input_frames == 0)
				src_data.end_of_input = 1 ;
			} ;

		/*
		** Now call process function. However, we need to set the mode
		** to SRC_MODE_PROCESS first and when we return set it back to
		** SRC_MODE_CALLBACK.
		*/
		psrc->mode = SRC_MODE_PROCESS ;
		error = src_process (state, &src_data) ;
		psrc->mode = SRC_MODE_CALLBACK ;

		if (error != 0)
			break ;

		src_data.data_in += src_data.input_frames_used * psrc->channels ;
		src_data.input_frames -= src_data.input_frames_used ;

		src_data.data_out += src_data.output_frames_gen * psrc->channels ;
		src_data.output_frames -= src_data.output_frames_gen ;

		output_frames_gen += src_data.output_frames_gen ;

		if (src_data.end_of_input == SRC_TRUE && src_data.output_frames_gen == 0)
			break ;
		} ;

	psrc->saved_data = src_data.data_in ;
	psrc->saved_frames = src_data.input_frames ;

	if (error != 0)
	{	psrc->error = error ;
	 	return 0 ;
		} ;

	return output_frames_gen ;
}